

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O2

qpdflogger_handle qpdfjob_get_logger(qpdfjob_handle j)

{
  _qpdflogger_handle *this;
  QPDFJob local_20;
  
  this = (_qpdflogger_handle *)operator_new(0x10);
  QPDFJob::getLogger(&local_20);
  _qpdflogger_handle::_qpdflogger_handle(this,(shared_ptr<QPDFLogger> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return this;
}

Assistant:

qpdflogger_handle
qpdfjob_get_logger(qpdfjob_handle j)
{
    return new _qpdflogger_handle(j->j.getLogger());
}